

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memvar_propagation.hpp
# Opt level: O3

void __thiscall
optimization::memvar_propagation::Memory_Var_Propagation::optimize_mir
          (Memory_Var_Propagation *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Rb_tree_header *p_Var1;
  MirFunction *func;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var3 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(package->functions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      bVar2 = check_effect(this,(MirFunction *)(p_Var3 + 2));
      if (bVar2) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->unaffected_call,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                  );
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    p_Var3 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  for (; (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    func = (MirFunction *)(p_Var3 + 2);
    if (this->aftercast == true) {
      optimize_func1(this,func,package);
      delete_store2(this,func);
    }
    else {
      optimize_func(this,func);
    }
  }
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         ++iter) {
      if (check_effect(iter->second)) {
        unaffected_call.insert(iter->first);
      }
    }
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         ++iter) {
      if (aftercast) {
        optimize_func1(iter->second, package);
        delete_store2(iter->second);
      } else {
        optimize_func(iter->second);
      }
    }
  }